

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesTestsUtil.cpp
# Opt level: O2

void vkt::sparse::submitCommandsAndWait
               (DeviceInterface *vk,VkDevice device,VkQueue queue,VkCommandBuffer commandBuffer,
               deUint32 waitSemaphoreCount,VkSemaphore *pWaitSemaphores,
               VkPipelineStageFlags *pWaitDstStageMask,deUint32 signalSemaphoreCount,
               VkSemaphore *pSignalSemaphores)

{
  VkResult VVar1;
  VkCommandBuffer commandBuffer_local;
  RefBase<vk::Handle<(vk::HandleType)6>_> local_b8;
  VkFenceCreateInfo fenceParams;
  VkSubmitInfo submitInfo;
  
  fenceParams.flags = 0;
  fenceParams._20_4_ = 0;
  fenceParams.sType = VK_STRUCTURE_TYPE_FENCE_CREATE_INFO;
  fenceParams._4_4_ = 0;
  fenceParams.pNext = (void *)0x0;
  commandBuffer_local = commandBuffer;
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&submitInfo,vk,device,&fenceParams,
                    (VkAllocationCallbacks *)0x0);
  local_b8.m_data.deleter.m_device = (VkDevice)submitInfo._16_8_;
  local_b8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)submitInfo.pWaitSemaphores;
  local_b8.m_data.object.m_internal = submitInfo._0_8_;
  local_b8.m_data.deleter.m_deviceIface = (DeviceInterface *)submitInfo.pNext;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)6>_> *)&submitInfo);
  submitInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = waitSemaphoreCount;
  submitInfo.pWaitDstStageMask = pWaitDstStageMask;
  submitInfo.commandBufferCount = 1;
  submitInfo.pCommandBuffers = &commandBuffer_local;
  submitInfo.signalSemaphoreCount = signalSemaphoreCount;
  submitInfo.pSignalSemaphores = pSignalSemaphores;
  submitInfo.pWaitSemaphores = pWaitSemaphores;
  VVar1 = (*vk->_vptr_DeviceInterface[2])(vk,queue,1,&submitInfo,local_b8.m_data.object.m_internal);
  ::vk::checkResult(VVar1,"vk.queueSubmit(queue, 1u, &submitInfo, *fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesTestsUtil.cpp"
                    ,0x231);
  VVar1 = (*vk->_vptr_DeviceInterface[0x16])(vk,device,1,&local_b8,1,0xffffffffffffffff);
  ::vk::checkResult(VVar1,"vk.waitForFences(device, 1u, &fence.get(), DE_TRUE, ~0ull)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesTestsUtil.cpp"
                    ,0x232);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::~RefBase(&local_b8);
  return;
}

Assistant:

void submitCommandsAndWait (const DeviceInterface&		vk,
							const VkDevice				device,
							const VkQueue				queue,
							const VkCommandBuffer		commandBuffer,
							const deUint32				waitSemaphoreCount,
							const VkSemaphore*			pWaitSemaphores,
							const VkPipelineStageFlags*	pWaitDstStageMask,
							const deUint32				signalSemaphoreCount,
							const VkSemaphore*			pSignalSemaphores)
{
	const VkFenceCreateInfo	fenceParams =
	{
		VK_STRUCTURE_TYPE_FENCE_CREATE_INFO,	// VkStructureType		sType;
		DE_NULL,								// const void*			pNext;
		0u,										// VkFenceCreateFlags	flags;
	};
	const Unique<VkFence> fence(createFence(vk, device, &fenceParams));

	const VkSubmitInfo submitInfo =
	{
		VK_STRUCTURE_TYPE_SUBMIT_INFO,		// VkStructureType				sType;
		DE_NULL,							// const void*					pNext;
		waitSemaphoreCount,					// deUint32						waitSemaphoreCount;
		pWaitSemaphores,					// const VkSemaphore*			pWaitSemaphores;
		pWaitDstStageMask,					// const VkPipelineStageFlags*	pWaitDstStageMask;
		1u,									// deUint32						commandBufferCount;
		&commandBuffer,						// const VkCommandBuffer*		pCommandBuffers;
		signalSemaphoreCount,				// deUint32						signalSemaphoreCount;
		pSignalSemaphores,					// const VkSemaphore*			pSignalSemaphores;
	};

	VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo, *fence));
	VK_CHECK(vk.waitForFences(device, 1u, &fence.get(), DE_TRUE, ~0ull));
}